

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_GroundLogisticsVehicle.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::GED_GroundLogisticsVehicle::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GED_GroundLogisticsVehicle *this)

{
  ostream *poVar1;
  char cVar2;
  ulong uVar3;
  EntityType local_390;
  KString local_380;
  string local_360 [32];
  KStringStream ss;
  ostream local_330 [376];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_330,"GED Basic Fixed Wing Aircraft\n");
  poVar1 = std::operator<<(poVar1,"\tEntity ID:                  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16EntityID);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tLocation Offsets(x,y,z):    ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16Offsets[0]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16Offsets[1]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_i16Offsets[2]);
  poVar1 = std::operator<<(poVar1,"\n");
  EntityType::EntityType(&local_390,'\x01','\x02',0,'\0','\0','\0','\0');
  DATA_TYPE::EntityAppearance::GetAsString_abi_cxx11_(&local_380,&this->m_EA,&local_390);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator<<(local_1a8,'\t');
  uVar3 = 0;
  while( true ) {
    uVar3 = uVar3 & 0xffff;
    if (local_380._M_string_length <= uVar3) break;
    cVar2 = local_380._M_dataplus._M_p[uVar3];
    if (local_380._M_string_length - 1 != uVar3 && cVar2 == '\n') {
      cVar2 = '\t';
      std::operator<<(local_1a8,'\n');
    }
    std::operator<<(local_1a8,cVar2);
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  poVar1 = std::operator<<(poVar1,local_360);
  poVar1 = std::operator<<(poVar1,"\tOrientation(Psi,Theta,Phi): ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8Ori[0]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8Ori[1]);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8Ori[2]);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"\tSpeed:                      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(short)this->m_i8Spd);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_360);
  std::__cxx11::string::~string((string *)&local_380);
  DataTypeBase::~DataTypeBase(&local_390.super_DataTypeBase);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString GED_GroundLogisticsVehicle::GetAsString() const
{
    KStringStream ss;

    ss << "GED Basic Fixed Wing Aircraft\n"
       << "\tEntity ID:                  " << m_ui16EntityID  << "\n"
       << "\tLocation Offsets(x,y,z):    " << m_i16Offsets[0] << " " << m_i16Offsets[1] << " " << m_i16Offsets[2] << "\n"
       << IndentString( m_EA.GetAsString( EntityType( Platform, Air, 0, 0, 0, 0, 0 ) ), 1 )
       << "\tOrientation(Psi,Theta,Phi): " << ( KINT16 )m_i8Ori[0]    << " " << ( KINT16 )m_i8Ori[1] << " " << ( KINT16 )m_i8Ori[2] << "\n"
       << "\tSpeed:                      " << ( KINT16 )m_i8Spd       << "\n";

    return ss.str();
}